

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O3

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::LogicalGet::ParamsToString_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,LogicalGet *this)

{
  _Rb_tree_header *p_Var1;
  table_function_to_string_t p_Var2;
  undefined8 uVar3;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pTVar4;
  const_reference pvVar5;
  _Base_ptr p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  pointer this_01;
  long *plVar8;
  string *psVar9;
  idx_t params;
  size_type *psVar10;
  bool bVar11;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range2;
  unsigned_long in_R8;
  pointer key;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  to_string_result;
  TableFunctionToStringInput input;
  string filters_info;
  undefined1 local_128 [16];
  undefined1 local_118 [64];
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d8;
  undefined1 local_d0 [32];
  char *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Exception local_90;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_buckets =
       &(__return_storage_ptr__->map_idx)._M_h._M_single_bucket;
  (__return_storage_ptr__->map_idx)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->map_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_element_count = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_b0 = local_a8._M_local_buf + 8;
  local_a8._M_allocated_capacity = 0;
  local_a8._M_local_buf[8] = '\0';
  p_Var6 = (this->table_filters).filters._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->table_filters).filters._M_t._M_impl.super__Rb_tree_header;
  local_d8 = __return_storage_ptr__;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    bVar11 = true;
    do {
      if (*(ulong *)(p_Var6 + 1) <
          (ulong)((long)(this->names).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->names).
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        if (!bVar11) {
          ::std::__cxx11::string::append((char *)&local_b0);
        }
        pTVar4 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                             *)&p_Var6[1]._M_parent);
        pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[](&this->names,*(size_type *)(p_Var6 + 1));
        (*pTVar4->_vptr_TableFilter[3])(local_128,pTVar4,pvVar5);
        ::std::__cxx11::string::_M_append((char *)&local_b0,local_128._0_8_);
        if ((undefined1 *)local_128._0_8_ != local_118) {
          operator_delete((void *)local_128._0_8_);
        }
        bVar11 = false;
      }
      p_Var6 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  local_128._0_8_ = (string *)local_118;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Filters","");
  this_00 = local_d8;
  pbVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](local_d8,(string *)local_128);
  ::std::__cxx11::string::_M_assign((string *)pbVar7);
  if ((string *)local_128._0_8_ != (string *)local_118) {
    operator_delete((void *)local_128._0_8_);
  }
  if ((this->extra_info).sample_options.
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl != (SampleOptions *)0x0) {
    this_01 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
              operator->(&(this->extra_info).sample_options);
    Value::ToString_abi_cxx11_(&local_50,&this_01->sample_size);
    in_R8 = 8;
    plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1d8f66c);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((TableFunction *)*plVar8 == (TableFunction *)psVar10) {
      local_d0._16_8_ = *psVar10;
      local_d0._24_8_ = plVar8[3];
      local_d0._0_8_ = (TableFunction *)(local_d0 + 0x10);
    }
    else {
      local_d0._16_8_ = *psVar10;
      local_d0._0_8_ = (TableFunction *)*plVar8;
    }
    local_d0._8_8_ = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)::std::__cxx11::string::append(local_d0);
    psVar9 = (string *)(plVar8 + 2);
    if ((string *)*plVar8 == psVar9) {
      local_118._0_8_ = (psVar9->_M_dataplus)._M_p;
      local_118._8_4_ = (undefined4)plVar8[3];
      local_118._12_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
      local_128._0_8_ = (string *)local_118;
    }
    else {
      local_118._0_8_ = (psVar9->_M_dataplus)._M_p;
      local_128._0_8_ = (string *)*plVar8;
    }
    local_128._8_8_ = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Sample Method","");
    pbVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](this_00,&local_70);
    ::std::__cxx11::string::operator=((string *)pbVar7,(string *)local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((string *)local_128._0_8_ != (string *)local_118) {
      operator_delete((void *)local_128._0_8_);
    }
    if ((TableFunction *)local_d0._0_8_ != (TableFunction *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((this->extra_info).file_filters._M_string_length != 0) {
    local_128._0_8_ = (string *)local_118;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"File Filters","");
    pbVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](this_00,(string *)local_128);
    ::std::__cxx11::string::_M_assign((string *)pbVar7);
    if ((string *)local_128._0_8_ != (string *)local_118) {
      operator_delete((void *)local_128._0_8_);
    }
    if (((this->extra_info).filtered_files.index != 0xffffffffffffffff) &&
       ((this->extra_info).total_files.index != 0xffffffffffffffff)) {
      local_90._0_8_ = local_80;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"%llu/%llu","");
      psVar9 = (string *)optional_idx::GetIndex(&(this->extra_info).filtered_files);
      params = optional_idx::GetIndex(&(this->extra_info).total_files);
      Exception::ConstructMessage<unsigned_long,unsigned_long>
                ((string *)local_128,&local_90,psVar9,params,in_R8);
      local_d0._0_8_ = (TableFunction *)(local_d0 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Scanning Files","");
      pbVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](this_00,(string *)local_d0);
      ::std::__cxx11::string::operator=((string *)pbVar7,(string *)local_128);
      if ((TableFunction *)local_d0._0_8_ != (TableFunction *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((string *)local_128._0_8_ != (string *)local_118) {
        operator_delete((void *)local_128._0_8_);
      }
      if ((undefined1 *)local_90._0_8_ != local_80) {
        operator_delete((void *)local_90._0_8_);
      }
    }
  }
  p_Var2 = (this->function).to_string;
  if (p_Var2 != (table_function_to_string_t)0x0) {
    local_d0._0_8_ = &this->function;
    local_d0._8_8_ =
         (this->bind_data).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    (*p_Var2)((InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_128,(TableFunctionToStringInput *)local_d0);
    uVar3 = local_128._8_8_;
    for (key = (pointer)local_128._0_8_; key != (pointer)uVar3; key = key + 1) {
      pbVar7 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[](this_00,&key->first);
      ::std::__cxx11::string::_M_assign((string *)pbVar7);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)(local_118 + 8));
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_128);
  }
  LogicalOperator::SetParamsEstimatedCardinality(&this->super_LogicalOperator,this_00);
  if (local_b0 != local_a8._M_local_buf + 8) {
    operator_delete(local_b0);
  }
  return this_00;
}

Assistant:

InsertionOrderPreservingMap<string> LogicalGet::ParamsToString() const {
	InsertionOrderPreservingMap<string> result;

	string filters_info;
	bool first_item = true;
	for (auto &kv : table_filters.filters) {
		auto &column_index = kv.first;
		auto &filter = kv.second;
		if (column_index < names.size()) {
			if (!first_item) {
				filters_info += "\n";
			}
			first_item = false;
			filters_info += filter->ToString(names[column_index]);
		}
	}
	result["Filters"] = filters_info;

	if (extra_info.sample_options) {
		result["Sample Method"] = "System: " + extra_info.sample_options->sample_size.ToString() + "%";
	}

	if (!extra_info.file_filters.empty()) {
		result["File Filters"] = extra_info.file_filters;
		if (extra_info.filtered_files.IsValid() && extra_info.total_files.IsValid()) {
			result["Scanning Files"] = StringUtil::Format("%llu/%llu", extra_info.filtered_files.GetIndex(),
			                                              extra_info.total_files.GetIndex());
		}
	}

	if (function.to_string) {
		TableFunctionToStringInput input(function, bind_data.get());
		auto to_string_result = function.to_string(input);
		for (const auto &it : to_string_result) {
			result[it.first] = it.second;
		}
	}
	SetParamsEstimatedCardinality(result);
	return result;
}